

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_wrapper.cpp
# Opt level: O0

void __thiscall
pstore::command_line::word_wrapper::word_wrapper
          (word_wrapper *this,string *text,size_t max_width,size_t pos)

{
  size_t pos_local;
  size_t max_width_local;
  string *text_local;
  word_wrapper *this_local;
  
  this->text_ = text;
  this->max_width_ = max_width;
  this->start_pos_ = pos;
  std::__cxx11::string::string((string *)&this->substr_);
  next(this);
  return;
}

Assistant:

word_wrapper::word_wrapper (std::string const & text, std::size_t const max_width,
                                        std::size_t const pos)
                    : text_{text}
                    , max_width_{max_width}
                    , start_pos_{pos} {
                this->next ();
            }